

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O0

void sbfTport_parseWeights(sbfTport tport)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 *puVar4;
  long in_RDI;
  sbfTportWeight *w;
  char *endptr;
  unsigned_long ul;
  char pattern [256];
  char *cp;
  char *value;
  char name [64];
  u_int i;
  sbfKeyValue properties;
  char *local_178;
  ulong local_170;
  char local_168 [256];
  char *local_68;
  char *local_60;
  char local_58 [68];
  uint local_14;
  undefined8 local_10;
  long local_8;
  
  local_10 = *(undefined8 *)(in_RDI + 0x18);
  local_8 = in_RDI;
  for (local_14 = 0; local_14 < 0xffff; local_14 = local_14 + 1) {
    snprintf(local_58,0x40,"weight%u",(ulong)local_14);
    local_60 = (char *)sbfKeyValue_get(local_10,local_58);
    if (local_60 != (char *)0x0) {
      local_68 = strchr(local_60,0x2c);
      if (local_68 == (char *)0x0) {
        sbfLog_log(*(undefined8 *)(local_8 + 8),2,"missing comma in weight%u property (%s)",local_14
                   ,local_60);
      }
      else {
        local_170 = strtoul(local_68 + 1,&local_178,10);
        if ((local_170 < 0x10000) && ((local_178 == (char *)0x0 || (*local_178 == '\0')))) {
          if ((ulong)((long)local_68 - (long)local_60) < 0x100) {
            memcpy(local_168,local_60,(long)local_68 - (long)local_60);
            local_68[(long)(local_168 + -(long)local_60)] = '\0';
            uVar3 = sbfMemory_realloc(*(undefined8 *)(local_8 + 0x168),*(int *)(local_8 + 0x160) + 1
                                      ,0x48);
            *(undefined8 *)(local_8 + 0x168) = uVar3;
            uVar1 = *(uint *)(local_8 + 0x160);
            *(uint *)(local_8 + 0x160) = uVar1 + 1;
            puVar4 = (undefined4 *)(*(long *)(local_8 + 0x168) + (ulong)uVar1 * 0x48);
            iVar2 = regcomp((regex_t *)(puVar4 + 2),local_168,9);
            if (iVar2 == 0) {
              *puVar4 = (int)local_170;
              sbfLog_log(*(undefined8 *)(local_8 + 8),0,"weight pattern %s is %u",local_168,*puVar4)
              ;
            }
            else {
              sbfLog_log(*(undefined8 *)(local_8 + 8),2,"weight%u pattern is invalid (%s)",local_14,
                         local_60);
              *(int *)(local_8 + 0x160) = *(int *)(local_8 + 0x160) + -1;
            }
          }
          else {
            sbfLog_log(*(undefined8 *)(local_8 + 8),2,"weight%u pattern is too long (%s)",local_14,
                       local_60);
          }
        }
        else {
          sbfLog_log(*(undefined8 *)(local_8 + 8),2,"bad number in weight%u property (%s)",local_14,
                     local_60);
        }
      }
    }
  }
  return;
}

Assistant:

void
sbfTport_parseWeights (sbfTport tport)
{
    sbfKeyValue      properties = tport->mProperties;
    u_int            i;
    char             name[64];
    const char*      value;
    const char*      cp;
    char             pattern[256];
    unsigned long    ul;
    char*            endptr;
    sbfTportWeight*  w;

    for (i = 0; i < USHRT_MAX; i++)
    {
        snprintf (name, sizeof name, "weight%u", i);
        if ((value = sbfKeyValue_get (properties, name)) == NULL)
            continue;
        cp = strchr (value, ',');
        if (cp == NULL)
        {
            sbfLog_warn (tport->mLog,
                         "missing comma in weight%u property (%s)",
                         i,
                         value);
            continue;
        }

        ul = strtoul (cp + 1, &endptr, 10);
        if (ul > USHRT_MAX || (endptr != NULL && *endptr != '\0'))
        {
            sbfLog_warn (tport->mLog,
                         "bad number in weight%u property (%s)",
                         i,
                         value);
            continue;
        }

        if ((size_t)(cp - value) > (sizeof pattern) - 1)
        {
            sbfLog_warn (tport->mLog,
                         "weight%u pattern is too long (%s)",
                         i,
                         value);
            continue;
        }
        memcpy (pattern, value, cp - value);
        pattern[cp - value] = '\0';

        tport->mWeightsList = xrealloc (tport->mWeightsList,
                                        tport->mWeightsListSize + 1,
                                        sizeof *tport->mWeightsList);
        w = &tport->mWeightsList[tport->mWeightsListSize++];

        if (regcomp (&w->mPattern, pattern, REG_EXTENDED|REG_NOSUB) != 0)
        {
            sbfLog_warn (tport->mLog,
                         "weight%u pattern is invalid (%s)",
                         i,
                         value);
            tport->mWeightsListSize--;
            continue;
        }
        w->mWeight = ul;
        sbfLog_debug (tport->mLog,
                      "weight pattern %s is %u",
                      pattern,
                      w->mWeight);
    }

}